

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_71db7::MemoryBufferMMapFile<llvm::MemoryBuffer>::MemoryBufferMMapFile
          (MemoryBufferMMapFile<llvm::MemoryBuffer> *this,bool RequiresNullTerminator,int FD,
          uint64_t Len,uint64_t Offset,error_code *EC)

{
  bool bVar1;
  uint64_t length;
  uint64_t offset;
  EVP_PKEY_CTX *ctx;
  char *Start;
  error_code *EC_local;
  uint64_t Offset_local;
  uint64_t Len_local;
  int FD_local;
  bool RequiresNullTerminator_local;
  MemoryBufferMMapFile<llvm::MemoryBuffer> *this_local;
  
  llvm::MemoryBuffer::MemoryBuffer(&this->super_MemoryBuffer);
  (this->super_MemoryBuffer)._vptr_MemoryBuffer = (_func_int **)&PTR__MemoryBufferMMapFile_00257788;
  length = getLegalMapSize(Len,Offset);
  offset = getLegalMapOffset(Offset);
  llvm::sys::fs::mapped_file_region::mapped_file_region(&this->MFR,FD,readonly,length,offset,EC);
  bVar1 = std::error_code::operator_cast_to_bool(EC);
  if (!bVar1) {
    ctx = (EVP_PKEY_CTX *)getStart(this,Len,Offset);
    llvm::MemoryBuffer::init(&this->super_MemoryBuffer,ctx);
  }
  return;
}

Assistant:

MemoryBufferMMapFile(bool RequiresNullTerminator, int FD, uint64_t Len,
                       uint64_t Offset, std::error_code &EC)
      : MFR(FD, MB::Mapmode, getLegalMapSize(Len, Offset),
            getLegalMapOffset(Offset), EC) {
    if (!EC) {
      const char *Start = getStart(Len, Offset);
      MemoryBuffer::init(Start, Start + Len, RequiresNullTerminator);
    }
  }